

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SslSocket.cpp
# Opt level: O1

SslTcpSocket * SslTcpSocketImpl::SwitchToSsl(TcpSocket *pTcpSocket)

{
  int iVar1;
  BaseSocket *pBVar2;
  BaseSocketImpl *pBVar3;
  _Tuple_impl<0UL,_SslTcpSocketImpl_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>_>
  _Var4;
  unique_ptr<BaseSocket,_std::default_delete<BaseSocket>_> pSslTcpSocket;
  _Head_base<0UL,_BaseSocket_*,_false> local_30;
  _Bind<int_(SslTcpSocketImpl::*(SslTcpSocketImpl_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>))(const_unsigned_char_*,_unsigned_long,_bool_&)>
  local_28;
  
  pBVar2 = (BaseSocket *)operator_new(0x10);
  SslTcpSocket::SslTcpSocket((SslTcpSocket *)pBVar2,pTcpSocket);
  local_30._M_head_impl = pBVar2;
  pBVar2 = (BaseSocket *)__dynamic_cast(pBVar2,&BaseSocket::typeinfo,&SslTcpSocket::typeinfo,0);
  pBVar3 = BaseSocket::GetImpl(pBVar2);
  _Var4.super__Head_base<0UL,_SslTcpSocketImpl_*,_false>._M_head_impl =
       (_Head_base<0UL,_SslTcpSocketImpl_*,_false>)
       __dynamic_cast(pBVar3,&BaseSocketImpl::typeinfo,&typeinfo,0);
  local_28._M_f = (offset_in_SslTcpSocketImpl_to_subr)DatenEncode;
  local_28._8_8_ = 0;
  local_28._M_bound_args.
  super__Tuple_impl<0UL,_SslTcpSocketImpl_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>_>
  .super__Head_base<0UL,_SslTcpSocketImpl_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_SslTcpSocketImpl_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>_>
        )(_Tuple_impl<0UL,_SslTcpSocketImpl_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>_>
          )_Var4.super__Head_base<0UL,_SslTcpSocketImpl_*,_false>._M_head_impl;
  std::function<int(unsigned_char_const*,unsigned_long)>::operator=
            ((function<int(unsigned_char_const*,unsigned_long)> *)
             ((long)_Var4.super__Head_base<0UL,_SslTcpSocketImpl_*,_false>._M_head_impl + 0x248),
             (_Bind<int_(SslTcpSocketImpl::*(SslTcpSocketImpl_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(const_unsigned_char_*,_unsigned_long)>
              *)&local_28);
  local_28._M_f = (offset_in_SslTcpSocketImpl_to_subr)DatenDecode;
  local_28._8_8_ = 0;
  local_28._M_bound_args.
  super__Tuple_impl<0UL,_SslTcpSocketImpl_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>_>
  .super__Head_base<0UL,_SslTcpSocketImpl_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_SslTcpSocketImpl_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>_>
        )(_Tuple_impl<0UL,_SslTcpSocketImpl_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>_>
          )_Var4.super__Head_base<0UL,_SslTcpSocketImpl_*,_false>._M_head_impl;
  std::function<int(unsigned_char_const*,unsigned_long,bool&)>::operator=
            ((function<int(unsigned_char_const*,unsigned_long,bool&)> *)
             ((long)_Var4.super__Head_base<0UL,_SslTcpSocketImpl_*,_false>._M_head_impl + 0x1a8),
             &local_28);
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&BaseSocketImpl::s_mxClientSocket);
  if (iVar1 == 0) {
    std::
    deque<std::unique_ptr<BaseSocket,std::default_delete<BaseSocket>>,std::allocator<std::unique_ptr<BaseSocket,std::default_delete<BaseSocket>>>>
    ::emplace_back<std::unique_ptr<BaseSocket,std::default_delete<BaseSocket>>>
              ((deque<std::unique_ptr<BaseSocket,std::default_delete<BaseSocket>>,std::allocator<std::unique_ptr<BaseSocket,std::default_delete<BaseSocket>>>>
                *)&BaseSocketImpl::s_lstClientSocket,
               (unique_ptr<BaseSocket,_std::default_delete<BaseSocket>_> *)&local_30);
    pthread_mutex_unlock((pthread_mutex_t *)&BaseSocketImpl::s_mxClientSocket);
    if (local_30._M_head_impl != (BaseSocket *)0x0) {
      (*(((TcpSocket *)&(local_30._M_head_impl)->_vptr_BaseSocket)->super_BaseSocket).
        _vptr_BaseSocket[1])();
    }
    return (SslTcpSocket *)pBVar2;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

SslTcpSocket* SslTcpSocketImpl::SwitchToSsl(TcpSocket* pTcpSocket)
{
    unique_ptr<BaseSocket> pSslTcpSocket = make_unique<SslTcpSocket>(pTcpSocket);
    SslTcpSocket* pSslTcpSock = dynamic_cast<SslTcpSocket*>(pSslTcpSocket.get());
    SslTcpSocketImpl* pSslTcpSocketImpl = dynamic_cast<SslTcpSocketImpl*>(pSslTcpSock->GetImpl());

    pSslTcpSocketImpl->m_fnSslEncode = bind(&SslTcpSocketImpl::DatenEncode, pSslTcpSocketImpl, _1, _2);
    pSslTcpSocketImpl->m_fnSslDecode = bind(&SslTcpSocketImpl::DatenDecode, pSslTcpSocketImpl, _1, _2, _3);

    lock_guard<mutex> lock(s_mxClientSocket);
    s_lstClientSocket.push_back(move(pSslTcpSocket));

    return pSslTcpSock;
}